

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O1

void __thiscall
absl::lts_20250127::base_internal::
AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
operator()(AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
           *this,LogSeverity *args,char **args_1,int *args_2,char (*args_3) [38])

{
  LogSeverity LVar1;
  int iVar2;
  code *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar3 = *(code **)this;
  LVar1 = *args;
  pcVar4 = *args_1;
  iVar2 = *args_2;
  local_50[0] = local_40;
  sVar5 = strlen(*args_3);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,args_3,*args_3 + sVar5);
  (*pcVar3)(LVar1,pcVar4,iVar2,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

ReturnType operator()(CallArgs&&... args) const {
    return DoLoad()(std::forward<CallArgs>(args)...);
  }